

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O1

string * __thiscall
enact::AstSerialise::visitExpressionStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,ExpressionStmt *stmt)

{
  pointer pcVar1;
  Expr *pEVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  pcVar1 = (this->m_ident)._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (this->m_ident)._M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  pEVar2 = (stmt->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar2->_vptr_Expr[2])(&local_48,pEVar2,&this->field_0x8);
  uVar7 = 0xf;
  if (local_68 != local_58) {
    uVar7 = local_58[0];
  }
  if (uVar7 < (ulong)(local_40 + local_60)) {
    uVar7 = 0xf;
    if (local_48 != local_38) {
      uVar7 = local_38[0];
    }
    if ((ulong)(local_40 + local_60) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_68);
      goto LAB_00119a2c;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48);
LAB_00119a2c:
  local_88 = &local_78;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_78 = *plVar5;
    uStack_70 = puVar4[3];
  }
  else {
    local_78 = *plVar5;
    local_88 = (long *)*puVar4;
  }
  local_80 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitExpressionStmt(ExpressionStmt &stmt) {
        return m_ident + "(Stmt::Expression " + visitExpr(*stmt.expr) + ")";
    }